

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

OneStepDelayControl * __thiscall
slang::BumpAllocator::emplace<slang::ast::OneStepDelayControl,slang::SourceRange>
          (BumpAllocator *this,SourceRange *args)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  OneStepDelayControl *pOVar3;
  
  pOVar3 = (OneStepDelayControl *)allocate(this,0x20,8);
  SVar1 = args->startLoc;
  SVar2 = args->endLoc;
  (pOVar3->super_TimingControl).kind = OneStepDelay;
  (pOVar3->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pOVar3->super_TimingControl).sourceRange.startLoc = SVar1;
  (pOVar3->super_TimingControl).sourceRange.endLoc = SVar2;
  return pOVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }